

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  undefined1 local_60 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  solution;
  int local_40;
  int R;
  int G;
  int L;
  int S;
  int X;
  
  std::istream::operator>>
            ((istream *)&std::cin,
             (int *)((long)&solution.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node._M_size + 4));
  std::istream::ignore();
  std::istream::operator>>((istream *)&std::cin,&local_40);
  std::istream::ignore();
  std::istream::operator>>((istream *)&std::cin,&R);
  std::istream::ignore();
  solution.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_60 = (undefined1  [8])local_60;
  solution.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_60;
  do {
    std::istream::operator>>((istream *)&std::cin,&G);
    std::istream::ignore();
    std::istream::operator>>((istream *)&std::cin,&L);
    std::istream::ignore();
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cerr,
                        solution.
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node._M_size._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    plVar3 = (long *)std::ostream::operator<<(poVar2,R);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,G);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    plVar3 = (long *)std::ostream::operator<<(poVar2,L);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    bVar1 = find_solution(0,solution.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node._M_size._4_4_,local_40,R,G,L,false,
                          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_60);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"No solution found",0x11);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)((_List_node_base *)((long)local_60 + 0x10))->_M_next,
                        (long)((_List_node_base *)((long)local_60 + 0x10))->_M_prev);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60,(iterator)local_60);
  } while( true );
}

Assistant:

int main()
{
    int R; // the length of the road before the gap.
    cin >> R; cin.ignore();
    int G; // the length of the gap.
    cin >> G; cin.ignore();
    int L; // the length of the landing platform.
    cin >> L; cin.ignore();

    bool solution_found = false;
    std::list<std::string> solution;
    // game loop
    while (1)
    {
        int S; // the motorbike's speed.
        cin >> S; cin.ignore();
        int X; // the position on the road of the motorbike.
        cin >> X; cin.ignore();

        std::cerr << R << " " << G << " " << L << std::endl;
        std::cerr << S << " " << X << std::endl;
        // Write an action using cout. DON'T FORGET THE "<< endl"
        // To debug: cerr << "Debug messages..." << endl;

        if (!solution_found)
        {
            bool result = find_solution(0, R, G, L, S, X, false, solution);
            if (!result)
            {
                std::cerr << "No solution found" << std::endl;
            }
        } else if (solution.empty())
        {
            std::cout << "Solution is empty" << std::endl;
        }

        std::cout << solution.front() << std::endl;
        solution.pop_front();
    }
}